

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O2

void writebf(bool be,void *dst,int fldsiz,int pos,int siz,lword d)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  uint8_t *p;
  long lVar6;
  bool bVar7;
  
  iVar4 = pos + siz + 7 >> 3;
  iVar2 = fldsiz - iVar4;
  if (be != 0) {
    iVar2 = iVar4;
  }
  cVar1 = (char)(pos & 7U);
  bVar3 = -((char)siz + cVar1) & 7;
  iVar4 = 0xff << bVar3;
  lVar6 = d << bVar3;
  pbVar5 = (byte *)((long)iVar2 + (long)dst);
  iVar2 = (int)((pos & 7U) + siz + 7) >> 3;
  while( true ) {
    bVar7 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar7) break;
    bVar3 = 0xff;
    if (iVar2 == 0) {
      bVar3 = ~(byte)(-1 << (8U - cVar1 & 0x1f));
    }
    bVar3 = bVar3 & (byte)iVar4;
    if (be == 0) {
      *pbVar5 = ((byte)lVar6 ^ *pbVar5) & bVar3 ^ *pbVar5;
      pbVar5 = pbVar5 + 1;
    }
    else {
      pbVar5[-1] = ((byte)lVar6 ^ pbVar5[-1]) & bVar3 ^ pbVar5[-1];
      pbVar5 = pbVar5 + -1;
    }
    lVar6 = lVar6 >> 8;
    iVar4 = 0xff;
  }
  return;
}

Assistant:

void writebf(bool be,void *dst,int fldsiz,int pos,int siz,lword d)
/* write value to bitfield with length fldsiz, starting at bit-position pos */
{
  uint8_t *p = dst;
  uint8_t m,b;
  int n,sh;

  /* advance to start-byte (LSB) */
  if (be)
    p += (pos + siz + 7) >> 3;
  else
    p += fldsiz - ((pos + siz + 7) >> 3);

  pos &= 7;
  n = (pos + siz + 7) >> 3;  /* number of bytes to write */

  sh = (8 - ((pos + siz) & 7)) & 7;
  m = 0xff << sh;  /* initial mask for LSB */
  d <<= sh;  /* shift value to match bitfield */

  while (n--) {
    if (n == 0)
      m &= (1 << (8 - pos)) - 1;  /* apply mask for MSB */

    if (be) {
      /* write right to left, for big-endian target */
      b = *(--p) & ~m;
      *p = b | ((uint8_t)d & m);
    }
    else {
      /* write left to right, for little-endian target */
      b = *p & ~m;
      *p++ = b | ((uint8_t)d & m);
    }
    d >>= 8;
    m = 0xff;
  }
}